

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

char * mi_heap_strndup(mi_heap_t *heap,char *s,size_t n)

{
  long lVar1;
  size_t __n;
  char *__dest;
  
  if (s == (char *)0x0) {
    return (char *)0x0;
  }
  __n = _mi_strnlen(s,n);
  if (__n + 1 < 0x401) {
    lVar1 = *(long *)((long)heap->pages_free_direct + (__n + 8 & 0xfffffffffffffff8));
    __dest = *(char **)(lVar1 + 0x10);
    if (__dest != (char *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)__dest;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      goto LAB_0046e425;
    }
  }
  __dest = (char *)_mi_malloc_generic(heap,__n + 1,false,0);
LAB_0046e425:
  if (__dest == (char *)0x0) {
    return (char *)0x0;
  }
  memcpy(__dest,s,__n);
  __dest[__n] = '\0';
  return __dest;
}

Assistant:

char* mi_heap_strndup(mi_heap_t* heap, const char* s, size_t n) mi_attr_noexcept {
  if (s == NULL) return NULL;
  const size_t len = _mi_strnlen(s,n);  // len <= n
  char* t = (char*)mi_heap_malloc(heap, len+1);
  if (t == NULL) return NULL;
  _mi_memcpy(t, s, len);
  t[len] = 0;
  return t;
}